

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SAXParser::docCharacters
          (SAXParser *this,XMLCh *chars,XMLSize_t length,bool cdataSection)

{
  ulong local_30;
  XMLSize_t index;
  bool cdataSection_local;
  XMLSize_t length_local;
  XMLCh *chars_local;
  SAXParser *this_local;
  
  if ((this->fElemDepth != 0) && (this->fDocHandler != (DocumentHandler *)0x0)) {
    (**(code **)(*(long *)this->fDocHandler + 0x10))(this->fDocHandler,chars,length);
  }
  for (local_30 = 0; local_30 < this->fAdvDHCount; local_30 = local_30 + 1) {
    (*this->fAdvDHList[local_30]->_vptr_XMLDocumentHandler[2])
              (this->fAdvDHList[local_30],chars,length,(ulong)cdataSection);
  }
  return;
}

Assistant:

void SAXParser::docCharacters(  const   XMLCh* const    chars
                                , const XMLSize_t       length
                                , const bool            cdataSection)
{
    // Suppress the chars before the root element.
    if (fElemDepth)
    {
        // Just map to the SAX document handler
        if (fDocHandler)
            fDocHandler->characters(chars, length);
    }

    //
    //  If there are any installed advanced handlers, then lets call them
    //  with this info.
    //
    for (XMLSize_t index = 0; index < fAdvDHCount; index++)
        fAdvDHList[index]->docCharacters(chars, length, cdataSection);
}